

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmathlib.c
# Opt level: O1

int math_random(lua_State *L)

{
  int iVar1;
  ulong *puVar2;
  lua_Integer lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  lua_Integer lVar10;
  ulong uVar11;
  ulong uVar12;
  
  puVar2 = (ulong *)lua_touserdata(L,-0xf4629);
  uVar11 = puVar2[1];
  uVar5 = puVar2[2] ^ *puVar2;
  uVar6 = puVar2[3] ^ uVar11;
  uVar12 = (uVar11 * 0x280 | uVar11 * 5 >> 0x39) * 9;
  *puVar2 = *puVar2 ^ uVar6;
  puVar2[1] = uVar5 ^ uVar11;
  puVar2[2] = uVar11 << 0x11 ^ uVar5;
  puVar2[3] = uVar6 << 0x2d | uVar6 >> 0x13;
  iVar1 = lua_gettop(L);
  if (iVar1 == 2) {
    lVar10 = luaL_checkinteger(L,1);
    lVar3 = luaL_checkinteger(L,2);
  }
  else {
    if (iVar1 != 1) {
      if (iVar1 == 0) {
        lua_pushnumber(L,(double)(uVar12 >> 0xb) * 1.1102230246251565e-16);
        return 1;
      }
      iVar1 = luaL_error(L,"wrong number of arguments");
      return iVar1;
    }
    lVar3 = luaL_checkinteger(L,1);
    if (lVar3 == 0) goto LAB_001184a9;
    lVar10 = 1;
  }
  uVar11 = lVar3 - lVar10;
  if (lVar3 < lVar10) {
    luaL_argerror(L,1,"interval is empty");
  }
  if ((uVar11 + 1 & uVar11) == 0) {
    uVar12 = uVar12 & uVar11;
  }
  else {
    uVar5 = uVar11 >> 1 | uVar11;
    uVar5 = uVar5 >> 2 | uVar5;
    uVar5 = uVar5 >> 4 | uVar5;
    uVar5 = uVar5 >> 8 | uVar5;
    uVar5 = uVar5 >> 0x10 | uVar5;
    uVar5 = uVar5 >> 0x20 | uVar5;
    uVar12 = uVar12 & uVar5;
    if (uVar11 < uVar12) {
      uVar6 = *puVar2;
      uVar9 = puVar2[2];
      uVar4 = puVar2[3];
      uVar7 = puVar2[1];
      do {
        uVar9 = uVar9 ^ uVar6;
        uVar4 = uVar4 ^ uVar7;
        uVar6 = uVar6 ^ uVar4;
        uVar8 = uVar9 ^ uVar7;
        uVar9 = uVar7 << 0x11 ^ uVar9;
        uVar4 = uVar4 << 0x2d | uVar4 >> 0x13;
        uVar12 = (uVar7 * 0x280 | uVar7 * 5 >> 0x39) * 9 & uVar5;
        uVar7 = uVar8;
      } while (uVar11 < uVar12);
      *puVar2 = uVar6;
      puVar2[1] = uVar8;
      puVar2[2] = uVar9;
      puVar2[3] = uVar4;
    }
  }
  uVar12 = uVar12 + lVar10;
LAB_001184a9:
  lua_pushinteger(L,uVar12);
  return 1;
}

Assistant:

static int math_random (lua_State *L) {
  lua_Integer low, up;
  lua_Unsigned p;
  RanState *state = (RanState *)lua_touserdata(L, lua_upvalueindex(1));
  Rand64 rv = nextrand(state->s);  /* next pseudo-random value */
  switch (lua_gettop(L)) {  /* check number of arguments */
    case 0: {  /* no arguments */
      lua_pushnumber(L, I2d(rv));  /* float between 0 and 1 */
      return 1;
    }
    case 1: {  /* only upper limit */
      low = 1;
      up = luaL_checkinteger(L, 1);
      if (up == 0) {  /* single 0 as argument? */
        lua_pushinteger(L, I2UInt(rv));  /* full random integer */
        return 1;
      }
      break;
    }
    case 2: {  /* lower and upper limits */
      low = luaL_checkinteger(L, 1);
      up = luaL_checkinteger(L, 2);
      break;
    }
    default: return luaL_error(L, "wrong number of arguments");
  }
  /* random integer in the interval [low, up] */
  luaL_argcheck(L, low <= up, 1, "interval is empty");
  /* project random integer into the interval [0, up - low] */
  p = project(I2UInt(rv), (lua_Unsigned)up - (lua_Unsigned)low, state);
  lua_pushinteger(L, p + (lua_Unsigned)low);
  return 1;
}